

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_types.cpp
# Opt level: O2

void __thiscall SerializeSpan_Read_Test::SerializeSpan_Read_Test(SerializeSpan_Read_Test *this)

{
  anon_unknown.dwarf_62afb::SerializeSpan::SerializeSpan(&this->super_SerializeSpan);
  (this->super_SerializeSpan).super_Test._vptr_Test = (_func_int **)&PTR__Test_00186898;
  return;
}

Assistant:

TEST_F (SerializeSpan, Read) {
    using ::testing::_;

    SerializeSpan::mock_span_archive arch;
    EXPECT_CALL (arch, writen (_)).Times (0);
    EXPECT_CALL (arch, readn (_)).Times (1);

    std::array<simple_struct, 2> my;
    pstore::serialize::read (arch, ::pstore::gsl::span<simple_struct>{my});
}